

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_client.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *addr;
  int port;
  ostream *this;
  simple_client local_68;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 3) {
    addr = argv[1];
    port = atoi(argv[2]);
    simple_client::simple_client(&local_68,addr,port);
    argv_local._4_4_ = simple_client::run(&local_68);
    simple_client::~simple_client(&local_68);
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,"Usage: simple_client <address> <port>");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc != 3) {
		std::cerr << "Usage: simple_client <address> <port>" << std::endl;
		return -1;
	}

	return simple_client(argv[1], atoi(argv[2])).run();
}